

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

SQInteger __thiscall
SQVM::FallBackSet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  int iVar5;
  SQObjectPtr closure;
  SQObjectPtr t;
  
  SVar2 = (self->super_SQObject)._type;
  if ((SVar2 != OT_INSTANCE) && (SVar2 != OT_USERDATA)) {
    if (SVar2 != OT_TABLE) {
      return 1;
    }
    closure.super_SQObject._unVal = (SQObjectValue)((self->super_SQObject)._unVal.pClosure)->_env;
    if (closure.super_SQObject._unVal.pTable != (SQTable *)0x0) {
      closure.super_SQObject._type = OT_TABLE;
      pSVar1 = &((closure.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      bVar4 = Set(this,&closure,key,val,0x29a);
      SQObjectPtr::~SQObjectPtr(&closure);
      if (bVar4) {
        return 0;
      }
    }
  }
  closure.super_SQObject._type = OT_NULL;
  closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  t.super_SQObject._type = OT_NULL;
  t.super_SQObject._unVal.pTable = (SQTable *)0x0;
  pSVar3 = (self->super_SQObject)._unVal.pTable;
  iVar5 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[6]
          )(pSVar3,this,6);
  if ((char)iVar5 == '\0') {
    bVar4 = true;
  }
  else {
    Push(this,self);
    Push(this,key);
    Push(this,val);
    this->_nmetamethodscall = this->_nmetamethodscall + 1;
    bVar4 = Call(this,&closure,3,this->_top + -3,&t,0);
    if (bVar4) {
      Pop(this,3);
      val = (SQObjectPtr *)0x0;
      bVar4 = false;
    }
    else {
      Pop(this,3);
      bVar4 = (this->_lasterror).super_SQObject._type == OT_NULL;
      val = (SQObjectPtr *)0x2;
    }
    this->_nmetamethodscall = this->_nmetamethodscall + -1;
  }
  SQObjectPtr::~SQObjectPtr(&t);
  SQObjectPtr::~SQObjectPtr(&closure);
  if (bVar4) {
    return 1;
  }
  return (SQInteger)val;
}

Assistant:

SQInteger SQVM::FallBackSet(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val)
{
    switch(type(self)) {
    case OT_TABLE:
        if(_table(self)->_delegate) {
            if(Set(_table(self)->_delegate,key,val,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        //keps on going
    case OT_INSTANCE:
    case OT_USERDATA:{
        SQObjectPtr closure;
        SQObjectPtr t;
        if(_delegable(self)->GetMetaMethod(this, MT_SET, closure)) {
            Push(self);Push(key);Push(val);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 3, _top - 3, t, SQFalse)) {
                Pop(3);
                return FALLBACK_OK;
            }
            else {
                Pop(3);
                if(type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                     }
        break;
        default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}